

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generator.cpp
# Opt level: O3

void __thiscall Code_generator::visit(Code_generator *this,Inst_load_relative *s)

{
  Expression *pEVar1;
  uint uVar2;
  int iVar3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  string symbol;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a8;
  long local_a0;
  char local_98 [16];
  string local_88;
  string local_68;
  string local_48;
  
  ast::Instruction::check_alignment((Instruction *)s);
  uVar2 = s->ldst;
  if ((uVar2 & 2) != 0) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,
               "str instructions with PC relative address doesn\'t exist, only ldr exists","");
    error_report((Location *)&s->field_0x28,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    uVar2 = s->ldst;
  }
  if (uVar2 == 1) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,
               "ldrb instruction with PC relative address doesn\'t exist, only ldr exists","");
    error_report((Location *)&s->field_0x28,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
  }
  uVar2 = s->rd->n;
  iVar3 = (*s->target->_vptr_Expression[3])();
  if ((char)iVar3 != '\0') {
    pEVar1 = s->target;
    if (pEVar1->type == LABEL) {
      (*pEVar1->_vptr_Expression[4])(&local_a8,pEVar1);
      pEVar1 = s->target;
      iVar3 = pEVar1->value;
      p_Var4 = (_List_node_base *)operator_new(0x50);
      p_Var4->_M_next = (_List_node_base *)&s->field_0x28;
      p_Var4->_M_prev = (_List_node_base *)&pEVar1->location;
      p_Var4[1]._M_next = *(_List_node_base **)&s->field_0x40;
      p_Var4[1]._M_prev = (_List_node_base *)0x600000004;
      *(undefined4 *)&p_Var4[2]._M_next = 2;
      p_Var4[2]._M_prev = (_List_node_base *)&p_Var4[3]._M_prev;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&p_Var4[2]._M_prev,local_a8,local_a8->_M_local_buf + local_a0);
      *(uint *)&p_Var4[4]._M_prev = (ushort)iVar3 - 2;
      p_Var5 = (_List_node_base *)operator_new(0x18);
      p_Var5[1]._M_next = p_Var4;
      std::__detail::_List_node_base::_M_hook(p_Var5);
      DAT_0013db48 = DAT_0013db48 + 1;
      if (local_a8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98) goto LAB_001214dd;
    }
    else {
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,"Invalid expression, must be a label","");
      error_report(&pEVar1->location,&local_88);
      local_a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_88._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p == &local_88.field_2) goto LAB_001214dd;
    }
    operator_delete(local_a8);
  }
LAB_001214dd:
  ast::Sections::write16(*(uint *)&s->field_0x40,*(uint *)&s->field_0x44,(short)uVar2 + 0xc00);
  return;
}

Assistant:

void Code_generator::visit(Inst_load_relative *s)
{
	s->check_alignment();
	if ((s->ldst & 2) != 0) // is a STR
		error_report(&s->location, "str instructions with PC relative address doesn't exist, only ldr exists");
	if (s->ldst == 1)       // is a LDRB
		error_report(&s->location, "ldrb instruction with PC relative address doesn't exist, only ldr exists");
	unsigned code = LDR_RELATIVE_OPCODE + (s->rd->n << RD_POSITION);
	if (s->target->evaluate()) {
		auto target_type = s->target->get_type();
		if (target_type == Value_type::LABEL) {
			string symbol = s->target->get_symbol();
			auto addend = s->target->get_value() - 2;
			auto *reloc = new Relocation{&s->location, &s->target->location, s->section_index, s->section_offset,
							LDR_RELATIVE_CONSTANT_POSITION, LDR_RELATIVE_CONSTANT_SIZE,
							Relocation::Relocation_type::RELATIVE_UNSIGNED, symbol, addend};
			Relocations::add(reloc);
		}
		else
			error_report(&s->target->location, "Invalid expression, must be a label");
	}
	Sections::write16(s->section_index, s->section_offset, static_cast<uint16_t>(code));
}